

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O1

void __thiscall tst_future::finallyRejected(tst_future *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar3;
  PromiseResolver<void> PVar4;
  PromiseResolver<int> PVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar7;
  bool bVar8;
  char cVar9;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseDataBase<int,_void_(const_int_&)> *this_01;
  QSharedData *pQVar10;
  char *pcVar11;
  char *pcVar12;
  PromiseDataBase<int,_void_(const_int_&)> *this_02;
  QSharedData *pQVar13;
  QPromiseReject<int> *in_R8;
  char *reject;
  QByteArrayView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  PromiseResolver<int> resolver_2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_178;
  _Any_data local_170;
  undefined **local_160;
  PromiseData<int> *local_158;
  QSharedData *local_150;
  PromiseResolver<void> resolver;
  PromiseResolver<int> resolver_1;
  qsizetype local_110;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_100;
  QString error;
  Type input;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _func_int **local_58;
  _Any_data local_50;
  code *local_40;
  
  local_170._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&input,(int *)local_170._M_pod_data);
  QVar7 = input.super_QPromiseBase<int>.m_d;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((input.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this_00->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130778;
  QReadWriteLock::QReadWriteLock(&this_00->m_lock,0);
  this_00->m_settled = false;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  this_00->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130700;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar13 = &this_00->super_QSharedData;
  local_170._M_unused._M_object = &PTR__QPromiseBase_001306c8;
  local_170._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_170);
  local_170._M_unused._M_object = &PTR__QPromiseBase_00130540;
  if ((PromiseDataBase<void,_void_()> *)local_170._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar10 = (QSharedData *)(local_170._8_8_ + 8);
    (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_170._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_170._8_8_ + 8))();
    }
  }
  PVar4.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  local_78._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  local_98._M_unused._0_8_)->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
  ((long)local_98._M_unused._0_8_ + 8))->d = (Data *)PVar4.m_d.d;
  if (PVar4.m_d.d == (Data *)0x0) {
    pcStack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + 1;
    UNLOCK();
    pcStack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (PVar4.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar4.m_d.d = *(int *)PVar4.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar4.m_d.d == 0) {
      operator_delete((void *)PVar4.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  local_150 = &((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar10 = &((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_01 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  local_58 = (_func_int **)&PTR__PromiseDataBase_00130878;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130878;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00130810;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar10 = &this_01->super_QSharedData;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_001307d8;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00130570;
  if (this_01 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = &this_01->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (this_01 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (*this_01->_vptr_PromiseDataBase[1])();
    }
  }
  pQVar1 = local_150;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  error.d.d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  resolver_2 = resolver_1;
  local_170._M_unused._M_object = (void *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_170._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_158 = QVar7.d;
  LOCK();
  pQVar2 = &((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_160 = &PTR__QPromiseBase_001307d8;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = operator_new(0x20);
  *(void **)local_b8._M_unused._0_8_ = local_170._M_unused._M_object;
  if ((Data *)local_170._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._M_unused._0_8_ = *local_170._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = local_170._8_8_;
  if ((Data *)local_170._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_b8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_00130570;
  *(PromiseData<int> **)((long)local_b8._M_unused._0_8_ + 0x18) = local_158;
  if (local_158 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(local_158->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_b8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_001307d8;
  pcStack_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  local_160 = &PTR__QPromiseBase_00130570;
  if (local_158 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(local_158->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_158 != (PromiseData<int> *)0x0)) {
      (*(local_158->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if ((Data *)local_170._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._8_8_ = *(int *)local_170._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_170._8_8_ == 0) && ((Data *)local_170._8_8_ != (Data *)0x0)) {
      operator_delete((void *)local_170._8_8_,0x10);
    }
  }
  if ((Data *)local_170._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_170._M_unused._0_8_ = *local_170._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_170._M_unused._M_object == 0) && ((Data *)local_170._M_unused._0_8_ != (Data *)0x0))
    {
      operator_delete(local_170._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (this_00,(function<void_()> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&error,
             (QPromiseResolve<int> *)&resolver_2,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (this_00,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if (error.d.d != (Data *)0x0) {
    LOCK();
    ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) &&
       (error.d.d != (Data *)0x0)) {
      operator_delete(error.d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_00);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar7.d)
    ;
  }
  LOCK();
  (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_00->_vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar7.d)
    ;
  }
  QVar7.d = input.super_QPromiseBase<int>.m_d.d;
  bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar8 = (bool)(~bVar8 & ((QVar7.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                          ._M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_170._M_pod_data[0] = bVar8;
  pcVar11 = QTest::toString<bool>((bool *)local_170._M_pod_data);
  pcVar12 = QTest::toString<bool>((bool *)&resolver);
  cVar9 = QTest::compare_helper
                    (bVar8,"Compared values are not the same",pcVar11,pcVar12,"input.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x161);
  if (cVar9 != '\0') {
    bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
    resolver.m_d.d._0_1_ = 1;
    local_170._M_pod_data[0] = bVar8;
    pcVar11 = QTest::toString<bool>((bool *)local_170._M_pod_data);
    pcVar12 = QTest::toString<bool>((bool *)&resolver);
    reject = "output.isPending()";
    cVar9 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar11,pcVar12,"output.isPending()"
                       ,"true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x162);
    if (cVar9 != '\0') {
      error.d.d = (Data *)0x0;
      error.d.ptr = (char16_t *)0x0;
      error.d.size = 0;
      this_02 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
      this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&this_02->super_QSharedData = 0;
      (this_02->m_error).m_data._M_exception_object = (void *)0x0;
      this_02[1]._vptr_PromiseDataBase = (_func_int **)0x0;
      (this_02->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_02->m_catchers).d.size = 0;
      (this_02->m_handlers).d.size = 0;
      (this_02->m_catchers).d.d = (Data *)0x0;
      (this_02->m_handlers).d.d = (Data *)0x0;
      (this_02->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&this_02->m_lock = 0;
      *(undefined8 *)&this_02->m_settled = 0;
      *(undefined8 *)&this_02[1].super_QSharedData = 0;
      this_02->_vptr_PromiseDataBase = local_58;
      QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
      this_02->m_settled = false;
      (this_02->m_handlers).d.d = (Data *)0x0;
      (this_02->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (this_02->m_handlers).d.size = 0;
      (this_02->m_catchers).d.d = (Data *)0x0;
      (this_02->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_02->m_catchers).d.size = 0;
      (this_02->m_error).m_data._M_exception_object = (void *)0x0;
      this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00130810;
      this_02[1]._vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&this_02[1].super_QSharedData = 0;
      LOCK();
      (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar13 = &this_02->super_QSharedData;
      LOCK();
      (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           &PTR__QPromiseBase_001307d8;
      QtPromisePrivate::PromiseResolver<int>::PromiseResolver
                (&resolver_2,(QPromise<int> *)&resolver_1);
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           &PTR__QPromiseBase_00130570;
      if (this_02 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
        LOCK();
        pQVar1 = &this_02->super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (this_02 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
          (*this_02->_vptr_PromiseDataBase[1])();
        }
      }
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
      }
      local_178 = resolver_2.m_d.d;
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
      }
      local_100 = resolver_2.m_d.d;
      QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
                ((function<void_(const_int_&)> *)&local_170,
                 (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_178,
                 (QPromiseResolve<int> *)&local_100,(QPromiseReject<int> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (this_01,(function<void_(const_int_&)> *)&local_170);
      if (local_160 != (undefined **)0x0) {
        (*(code *)local_160)(&local_170,&local_170,__destroy_functor);
      }
      QVar6.d = local_100.d;
      QVar3.d = local_178.d;
      if (local_178.d != (Data *)0x0) {
        LOCK();
        ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_100.d != (Data *)0x0) {
        LOCK();
        ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
           operator_new(0x18);
      *(Data **)resolver.m_d.d = QVar3.d;
      if (QVar3.d != (Data *)0x0) {
        LOCK();
        ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)QVar6.d;
      if (QVar6.d == (Data *)0x0) {
        *(QString **)((long)resolver.m_d.d + 0x10) = &error;
      }
      else {
        LOCK();
        ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        *(QString **)((long)resolver.m_d.d + 0x10) = &error;
        LOCK();
        ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             ((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QVar6.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(QVar6.d,0x10);
        }
      }
      if (QVar3.d != (Data *)0x0) {
        LOCK();
        ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             ((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((QVar3.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
            super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
          operator_delete(QVar3.d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
      std::
      _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
      ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
      if (local_100.d != (Data *)0x0) {
        LOCK();
        ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type)
             ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           (local_100.d != (Data *)0x0)) {
          operator_delete(local_100.d,0x10);
        }
      }
      if (local_178.d != (Data *)0x0) {
        LOCK();
        ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((local_178.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
           (local_178.d != (Data *)0x0)) {
          operator_delete(local_178.d,0x10);
        }
      }
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver_2.m_d.d,0x10);
        }
      }
      bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
      if (!bVar8) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_01);
      }
      bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_02);
      while (bVar8 != false) {
        QCoreApplication::processEvents();
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_02);
      }
      LOCK();
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_02->_vptr_PromiseDataBase[1])(this_02);
      }
      LOCK();
      (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_02->_vptr_PromiseDataBase[1])(this_02);
      }
      bVar8 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
      bVar8 = (bool)(~bVar8 & (this_01->m_error).m_data._M_exception_object != (void *)0x0);
      resolver_1.m_d.d._0_1_ = bVar8;
      resolver_2.m_d.d._0_1_ = 1;
      pcVar11 = QTest::toString<bool>((bool *)&resolver_1);
      pcVar12 = QTest::toString<bool>((bool *)&resolver_2);
      cVar9 = QTest::compare_helper
                        (bVar8,"Compared values are not the same",pcVar11,pcVar12,
                         "output.isRejected()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x16c);
      if (cVar9 != '\0') {
        QVar14.m_data = (storage_type *)0x3;
        QVar14.m_size = (qsizetype)&resolver_1;
        QString::fromUtf8(QVar14);
        PVar5 = resolver_1;
        QVar15.m_data = error.d.ptr;
        QVar15.m_size = error.d.size;
        QVar16.m_data = (storage_type_conflict *)this_02;
        QVar16.m_size = local_110;
        QTest::qCompare(QVar15,QVar16,"error","QString{\"foo\"}",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                        ,0x16d);
        if (PVar5.m_d.d != (Data *)0x0) {
          LOCK();
          *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
          UNLOCK();
          if (*(int *)PVar5.m_d.d == 0) {
            QArrayData::deallocate((QArrayData *)PVar5.m_d.d,2,8);
          }
        }
      }
      if (error.d.d != (Data *)0x0) {
        LOCK();
        ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(error.d.d)->super_QArrayData,2,8);
        }
      }
    }
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  input.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00130570;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar13 = &((input.super_QPromiseBase<int>.m_d.d)->
               super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar13->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_future::finallyRejected()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            throw MyException{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    QString error;
    output
        .fail([&](const MyException& e) {
            error = e.error();
            return -1;
        })
        .wait();

    QCOMPARE(output.isRejected(), true);
    QCOMPARE(error, QString{"foo"});
}